

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall Alice::LoadNextShuffleVectors(Alice *this)

{
  allocator<std::vector<long,_std::allocator<long>_>_> *paVar1;
  int iVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  int local_128;
  int local_124;
  int j_1;
  int i_1;
  int local_f0;
  int local_ec;
  int j;
  int i;
  long temp;
  undefined1 local_d8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Z;
  undefined1 local_b8 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  Y;
  undefined1 local_98 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  X;
  undefined1 local_78 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  W;
  undefined1 local_58 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  V;
  undefined1 local_38 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  U;
  Alice *this_local;
  
  if (LoadNextShuffleVectors()::upin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::upin);
    if (iVar2 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::upin,"../randoms/alice/U_PA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::upin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::upin);
    }
  }
  if (LoadNextShuffleVectors()::udin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::udin);
    if (iVar2 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::udin,"../randoms/alice/U_DA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::udin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::udin);
    }
  }
  if (LoadNextShuffleVectors()::rpin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rpin);
    if (iVar2 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rpin,"../randoms/alice/R_PA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rpin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rpin);
    }
  }
  if (LoadNextShuffleVectors()::rdin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::rdin);
    if (iVar2 != 0) {
      std::ifstream::ifstream(LoadNextShuffleVectors()::rdin,"../randoms/alice/R_DA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::rdin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::rdin);
    }
  }
  if (LoadNextShuffleVectors()::pipin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pipin);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pipin,"../randoms/alice/Pi_diff_R_PB_PA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pipin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pipin);
    }
  }
  if (LoadNextShuffleVectors()::pidin == '\0') {
    iVar2 = __cxa_guard_acquire(&LoadNextShuffleVectors()::pidin);
    if (iVar2 != 0) {
      std::ifstream::ifstream
                (LoadNextShuffleVectors()::pidin,"../randoms/alice/Pi_diff_R_DB_DA.txt",8);
      __cxa_atexit(std::ifstream::~ifstream,LoadNextShuffleVectors()::pidin,&__dso_handle);
      __cxa_guard_release(&LoadNextShuffleVectors()::pidin);
    }
  }
  iVar2 = (this->super_Party).n_p;
  paVar1 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
           ((long)&V.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(paVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_38,(long)iVar2,paVar1);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&V.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (this->super_Party).n_p;
  paVar1 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
           ((long)&W.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(paVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_58,(long)iVar2,paVar1);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&W.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (this->super_Party).n_p;
  paVar1 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
           ((long)&X.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(paVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_78,(long)iVar2,paVar1);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&X.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (this->super_Party).n_d;
  paVar1 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
           ((long)&Y.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(paVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_98,(long)iVar2,paVar1);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&Y.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (this->super_Party).n_d;
  paVar1 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
           ((long)&Z.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(paVar1);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_b8,(long)iVar2,paVar1);
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)
             ((long)&Z.
                     super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = (this->super_Party).n_d;
  std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&temp + 7));
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)local_d8,(long)iVar2,
           (allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&temp + 7));
  std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
            ((allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&temp + 7));
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&(this->super_Party).U_P);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&(this->super_Party).U_D);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&(this->super_Party).R_P);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&(this->super_Party).R_D);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&this->Pi_P_diff_R_PB_R_PA);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::clear(&this->Pi_D_diff_R_DB_R_DA);
  for (local_ec = 0; local_ec < (this->super_Party).n_p; local_ec = local_ec + 1) {
    for (local_f0 = 0; local_f0 < 5; local_f0 = local_f0 + 1) {
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::upin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_38,(long)local_ec);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::rpin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_58,(long)local_ec);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::pipin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_78,(long)local_ec);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
    }
  }
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_38);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_38);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).U_P,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_58);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_58);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).R_P,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_78);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_78);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_P_diff_R_PB_R_PA,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  for (local_124 = 0; local_124 < (this->super_Party).n_d; local_124 = local_124 + 1) {
    for (local_128 = 0; local_128 < 2; local_128 = local_128 + 1) {
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::udin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_98,(long)local_124);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::rdin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_b8,(long)local_124);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
      std::istream::operator>>((istream *)LoadNextShuffleVectors()::pidin,(long *)&j);
      pvVar3 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                             *)local_d8,(long)local_124);
      std::vector<long,_std::allocator<long>_>::push_back(pvVar3,(value_type *)&j);
    }
  }
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_98);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_98);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).U_D,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_b8);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_b8);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&(this->super_Party).R_D,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  iVar4 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::begin((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)local_d8);
  iVar5 = std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::end((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_d8);
  std::
  vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
  ::
  assign<__gnu_cxx::__normal_iterator<std::vector<long,std::allocator<long>>*,std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>,void>
            ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
              *)&this->Pi_D_diff_R_DB_R_DA,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar4._M_current,
             (__normal_iterator<std::vector<long,_std::allocator<long>_>_*,_std::vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>_>
              )iVar5._M_current);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_d8);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_b8);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_98);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_78);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_58);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)local_38);
  return;
}

Assistant:

void Alice::LoadNextShuffleVectors()
{
    static std::ifstream upin("../randoms/alice/U_PA.txt");
    static std::ifstream udin("../randoms/alice/U_DA.txt");
    static std::ifstream rpin("../randoms/alice/R_PA.txt");
    static std::ifstream rdin("../randoms/alice/R_DA.txt");
    static std::ifstream pipin("../randoms/alice/Pi_diff_R_PB_PA.txt");
    static std::ifstream pidin("../randoms/alice/Pi_diff_R_DB_DA.txt");
    std::vector<std::vector<long>> U(n_p);
    std::vector<std::vector<long>> V(n_p);
    std::vector<std::vector<long>> W(n_p);
    std::vector<std::vector<long>> X(n_d);
    std::vector<std::vector<long>> Y(n_d);
    std::vector<std::vector<long>> Z(n_d);
    long temp;
    U_P.clear();
    U_D.clear();
    R_P.clear();
    R_D.clear();
    Pi_P_diff_R_PB_R_PA.clear();
    Pi_D_diff_R_DB_R_DA.clear();
    for (int i = 0; i < n_p; i++)
    {
        for (int j = 0; j < 5; j++)
        {
            upin >> temp;
            U[i].push_back(temp);
            rpin >> temp;
            V[i].push_back(temp);
            pipin >> temp;
            W[i].push_back(temp);
        }
    }
    U_P.assign(U.begin(), U.end());
    R_P.assign(V.begin(), V.end());
    Pi_P_diff_R_PB_R_PA.assign(W.begin(), W.end());
    for (int i = 0; i < n_d; i++)
    {
        for (int j = 0; j < 2; j++)
        {
            udin >> temp;
            X[i].push_back(temp);
            rdin >> temp;
            Y[i].push_back(temp);
            pidin >> temp;
            Z[i].push_back(temp);
        }
    }
    U_D.assign(X.begin(), X.end());
    R_D.assign(Y.begin(), Y.end());
    Pi_D_diff_R_DB_R_DA.assign(Z.begin(), Z.end());
}